

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

int get_kf_active_quality(PRIMARY_RATE_CONTROL *p_rc,int q,aom_bit_depth_t bit_depth)

{
  int iVar1;
  undefined *puVar2;
  undefined *puVar3;
  uint uVar4;
  
  uVar4 = bit_depth - AOM_BITS_8;
  if (uVar4 < 5) {
    puVar2 = (&PTR_kf_low_motion_minq_8_005d4998)[uVar4];
    puVar3 = (&PTR_kf_high_motion_minq_8_005d49c0)[uVar4];
  }
  else {
    puVar2 = (undefined *)0x0;
    puVar3 = (undefined *)0x0;
  }
  iVar1 = p_rc->kf_boost;
  if (5000 < iVar1) {
    return *(int *)(puVar2 + (long)q * 4);
  }
  if (iVar1 < 400) {
    return *(int *)(puVar3 + (long)q * 4);
  }
  return ((*(int *)(puVar3 + (long)q * 4) - *(int *)(puVar2 + (long)q * 4)) * (5000 - iVar1) + 0x8fc
         ) / 0x11f8 + *(int *)(puVar2 + (long)q * 4);
}

Assistant:

static int get_kf_active_quality(const PRIMARY_RATE_CONTROL *const p_rc, int q,
                                 aom_bit_depth_t bit_depth) {
  int *kf_low_motion_minq;
  int *kf_high_motion_minq;
  ASSIGN_MINQ_TABLE(bit_depth, kf_low_motion_minq);
  ASSIGN_MINQ_TABLE(bit_depth, kf_high_motion_minq);
  return get_active_quality(q, p_rc->kf_boost, kf_low, kf_high,
                            kf_low_motion_minq, kf_high_motion_minq);
}